

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant.hpp
# Opt level: O3

bool goodform::can_be<short>(any *v)

{
  float __x;
  double __x_00;
  bool bVar1;
  bool bVar2;
  double dVar3;
  bool bVar4;
  int *piVar5;
  long *plVar6;
  unsigned_short *puVar7;
  uint *puVar8;
  unsigned_long *puVar9;
  float *pfVar10;
  double *pdVar11;
  float fVar12;
  
  bVar4 = is<signed_char>(v);
  if (bVar4) {
    get<signed_char>(v);
  }
  else {
    bVar4 = is<short>(v);
    if (bVar4) {
      get<short>(v);
    }
    else {
      bVar4 = is<int>(v);
      if (bVar4) {
        piVar5 = get<int>(v);
        return (int)(short)*piVar5 == *piVar5;
      }
      bVar4 = is<long>(v);
      if (bVar4) {
        plVar6 = get<long>(v);
        return (long)(short)*plVar6 == *plVar6;
      }
      bVar4 = is<unsigned_char>(v);
      if (!bVar4) {
        bVar4 = is<unsigned_short>(v);
        if (bVar4) {
          puVar7 = get<unsigned_short>(v);
          return -1 < (short)*puVar7;
        }
        bVar4 = is<unsigned_int>(v);
        if (bVar4) {
          puVar8 = get<unsigned_int>(v);
          return *puVar8 < 0x8000;
        }
        bVar4 = is<unsigned_long>(v);
        if (bVar4) {
          puVar9 = get<unsigned_long>(v);
          return *puVar9 < 0x8000;
        }
        bVar4 = is<float>(v);
        if (bVar4) {
          pfVar10 = get<float>(v);
          __x = *pfVar10;
          fVar12 = floorf(__x);
          bVar2 = __x <= 32767.0;
          bVar1 = fVar12 == __x;
          bVar4 = __x < -32768.0;
        }
        else {
          bVar4 = is<double>(v);
          if (!bVar4) {
            bVar4 = is<short>(v);
            return bVar4;
          }
          pdVar11 = get<double>(v);
          __x_00 = *pdVar11;
          dVar3 = floor(__x_00);
          bVar2 = __x_00 <= 32767.0;
          bVar1 = dVar3 == __x_00;
          bVar4 = __x_00 < -32768.0;
        }
        return (bool)(!bVar4 & -bVar1 & -bVar2);
      }
      get<unsigned_char>(v);
    }
  }
  return true;
}

Assistant:

bool can_be(const any& v)
  {
    if (std::is_integral<T>::value)
    {
      if (is<std::int8_t>(v)) return detail::can_int_fit_value<T>(get<std::int8_t>(v));
      if (is<std::int16_t>(v)) return detail::can_int_fit_value<T>(get<std::int16_t>(v));
      if (is<std::int32_t>(v)) return detail::can_int_fit_value<T>(get<std::int32_t>(v));
      if (is<std::int64_t>(v)) return detail::can_int_fit_value<T>(get<std::int64_t>(v));
      if (is<std::uint8_t>(v)) return detail::can_int_fit_value<T>(get<std::uint8_t>(v));
      if (is<std::uint16_t>(v)) return detail::can_int_fit_value<T>(get<std::uint16_t>(v));
      if (is<std::uint32_t>(v)) return detail::can_int_fit_value<T>(get<std::uint32_t>(v));
      if (is<std::uint64_t>(v)) return detail::can_int_fit_value<T>(get<std::uint64_t>(v));
      if (is<float>(v))
      {
        float tmp = get<float>(v);
        return std::floor(tmp) == tmp && float(std::numeric_limits<T>::max()) >= tmp && float(std::numeric_limits<T>::min()) <= tmp;
      }
      if (is<double>(v))
      {
        double tmp = get<double>(v);
        return std::floor(tmp) == tmp && double(std::numeric_limits<T>::max()) >= tmp && double(std::numeric_limits<T>::min()) <= tmp;
      }
    }
    else if (std::is_same<T, double>::value)
    {
      return true;
    }
    else if (std::is_same<T, float>::value)
    {
      if (!is<double>(v))
        return true;
      else
      {
        float tmp = float(get<double>(v));
        if (double(tmp) == get<double>(v))
          return true;
      }
    }
    return is<T>(v);
  }